

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O1

int cmd_stressbuffer(char *args)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  time_t tVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  int iVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  char buf [37];
  char buf2 [37];
  char local_88 [48];
  char local_58 [40];
  
  pcVar13 = args;
  if (*args == '\"') {
    pcVar13 = args + 1;
    sVar6 = strlen(pcVar13);
    args[sVar6] = '\0';
  }
  uVar2 = atoi(pcVar13);
  if ((int)uVar2 < 0) {
    pcVar13 = "buffer must be greater than or equal to zero.";
LAB_00104ed6:
    puts(pcVar13);
    return 1;
  }
  printf("Stress testing with (%d) byte buffer...\n",(ulong)uVar2);
  lVar7 = PHYSFS_openWrite("test.txt");
  if (lVar7 == 0) {
    uVar11 = PHYSFS_getLastError();
    pcVar13 = "Couldn\'t open test.txt for writing: %s.\n";
  }
  else {
    iVar3 = PHYSFS_setBuffer(lVar7,uVar2);
    if (iVar3 == 0) {
      uVar11 = PHYSFS_getLastError();
      printf("PHYSFS_setBuffer() failed: %s.\n",uVar11);
      PHYSFS_close(lVar7);
      PHYSFS_delete("test.txt");
      return 1;
    }
    builtin_strncpy(local_88,"abcdefghijklmnopqrstuvwxyz0123456789",0x25);
    iVar3 = 0;
    tVar8 = time((time_t *)0x0);
    srand((uint)tVar8);
    do {
      iVar12 = 10000;
      do {
        iVar4 = rand();
        iVar4 = (int)(long)((double)iVar4 * 35.0 * 4.656612873077393e-10);
        uVar17 = (ulong)(0x23 - iVar4);
        uVar9 = PHYSFS_writeBytes(lVar7,local_88,uVar17);
        if (uVar9 != uVar17) {
LAB_00104ef5:
          uVar11 = PHYSFS_getLastError();
          pcVar13 = "PHYSFS_writeBytes() failed: %s.\n";
          goto LAB_00104f3b;
        }
        iVar5 = rand();
        if (((int)((double)iVar5 * 1000.0 * 4.656612873077393e-10) == 0x29) &&
           (iVar5 = PHYSFS_flush(lVar7), iVar5 == 0)) goto LAB_00104f2f;
        uVar10 = (ulong)(iVar4 + 1);
        uVar9 = PHYSFS_writeBytes(lVar7,local_88 + uVar17,uVar10);
        if (uVar9 != uVar10) goto LAB_00104ef5;
        iVar4 = rand();
        if (((int)((double)iVar4 * 1000.0 * 4.656612873077393e-10) == 0x29) &&
           (iVar4 = PHYSFS_flush(lVar7), iVar4 == 0)) goto LAB_00104f2f;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      iVar12 = PHYSFS_flush(lVar7);
      if (iVar12 == 0) goto LAB_00104f2f;
      iVar3 = iVar3 + 1;
    } while (iVar3 != 10);
    iVar3 = PHYSFS_close(lVar7);
    if (iVar3 != 0) {
      puts(" ... test file written ...");
      lVar7 = PHYSFS_openRead("test.txt");
      if (lVar7 == 0) {
        uVar11 = PHYSFS_getLastError();
        pcVar13 = "Failed to reopen stress file for reading: %s.\n";
        goto LAB_00104ee9;
      }
      iVar3 = PHYSFS_setBuffer(lVar7,uVar2);
      if (iVar3 == 0) {
        uVar11 = PHYSFS_getLastError();
        pcVar13 = "PHYSFS_setBuffer() failed: %s.\n";
        goto LAB_00104f3b;
      }
      uVar17 = 0;
      uVar9 = 0;
      do {
        do {
          iVar3 = rand();
          iVar3 = (int)(long)((double)iVar3 * 35.0 * 4.656612873077393e-10);
          uVar15 = (ulong)(0x23 - iVar3);
          uVar10 = PHYSFS_readBytes(lVar7,local_58,uVar15);
          if (uVar10 == uVar15) {
            iVar12 = rand();
            if (((int)((double)iVar12 * 1000.0 * 4.656612873077393e-10) == 0x29) &&
               (iVar12 = PHYSFS_flush(lVar7), iVar12 == 0)) {
LAB_00104ebd:
              uVar11 = PHYSFS_getLastError();
              pcVar13 = "PHYSFS_flush() failed: %s.\n";
              goto LAB_00104e64;
            }
            uVar16 = (ulong)(iVar3 + 1);
            uVar10 = PHYSFS_readBytes(lVar7,local_58 + uVar15,uVar16);
            if (uVar10 != uVar16) goto LAB_00104e58;
            iVar3 = rand();
            if (((int)((double)iVar3 * 1000.0 * 4.656612873077393e-10) == 0x29) &&
               (iVar3 = PHYSFS_flush(lVar7), iVar3 == 0)) goto LAB_00104ebd;
            iVar3 = bcmp(local_88,local_58,0x24);
            if (iVar3 != 0) {
              printf("readback is mismatched on iterations (%d, %d).\n",uVar9,uVar17);
              printf("wanted: [");
              lVar14 = 0;
              do {
                putchar((int)local_88[lVar14]);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x24);
              puts("]");
              printf("   got: [");
              lVar14 = 0;
              do {
                putchar((int)local_58[lVar14]);
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x24);
              puts("]");
              uVar9 = 0x24;
              goto LAB_00104e6e;
            }
            bVar1 = true;
          }
          else {
LAB_00104e58:
            uVar11 = PHYSFS_getLastError();
            pcVar13 = "PHYSFS_readBytes() failed: %s.\n";
LAB_00104e64:
            printf(pcVar13,uVar11);
LAB_00104e6e:
            PHYSFS_close(lVar7);
            bVar1 = false;
          }
          if (!bVar1) {
            return 1;
          }
          uVar2 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar2;
        } while (uVar2 != 10000);
        iVar3 = PHYSFS_flush(lVar7);
        if (iVar3 == 0) goto LAB_00104f2f;
        iVar3 = (int)uVar9;
        uVar17 = 0;
        uVar9 = (ulong)(iVar3 + 1);
      } while (iVar3 < 9);
      puts(" ... test file read ...");
      iVar3 = PHYSFS_eof(lVar7);
      if (iVar3 == 0) {
        puts("PHYSFS_eof() returned true! That\'s wrong.");
      }
      iVar3 = PHYSFS_close(lVar7);
      if (iVar3 != 0) {
        PHYSFS_delete("test.txt");
        pcVar13 = "stress test completed successfully.";
        goto LAB_00104ed6;
      }
    }
    uVar11 = PHYSFS_getLastError();
    pcVar13 = "PHYSFS_close() failed: %s.\n";
  }
LAB_00104ee9:
  printf(pcVar13,uVar11);
  return 1;
LAB_00104f2f:
  uVar11 = PHYSFS_getLastError();
  pcVar13 = "PHYSFS_flush() failed: %s.\n";
LAB_00104f3b:
  printf(pcVar13,uVar11);
  PHYSFS_close(lVar7);
  return 1;
}

Assistant:

static int cmd_stressbuffer(char *args)
{
    int num;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    num = atoi(args);
    if (num < 0)
        printf("buffer must be greater than or equal to zero.\n");
    else
    {
        PHYSFS_File *f;
        int rndnum;

        printf("Stress testing with (%d) byte buffer...\n", num);
        f = PHYSFS_openWrite("test.txt");
        if (f == NULL)
            printf("Couldn't open test.txt for writing: %s.\n", PHYSFS_getLastError());
        else
        {
            int i, j;
            char buf[37];
            char buf2[37];

            if (!PHYSFS_setBuffer(f, num))
            {
                printf("PHYSFS_setBuffer() failed: %s.\n", PHYSFS_getLastError());
                PHYSFS_close(f);
                PHYSFS_delete("test.txt");
                return 1;
            } /* if */

            strcpy(buf, "abcdefghijklmnopqrstuvwxyz0123456789");
            srand((unsigned int) time(NULL));

            for (i = 0; i < 10; i++)
            {
                for (j = 0; j < 10000; j++)
                {
                    PHYSFS_uint32 right = 1 + (PHYSFS_uint32) (35.0 * rand() / (RAND_MAX + 1.0));
                    PHYSFS_uint32 left = 36 - right;
                    if (PHYSFS_writeBytes(f, buf, left) != left)
                    {
                        printf("PHYSFS_writeBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */

                    if (PHYSFS_writeBytes(f, buf + left, right) != right)
                    {
                        printf("PHYSFS_writeBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */
                } /* for */

                if (!PHYSFS_flush(f))
                {
                    printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                    PHYSFS_close(f);
                    return 1;
                } /* if */

            } /* for */

            if (!PHYSFS_close(f))
            {
                printf("PHYSFS_close() failed: %s.\n", PHYSFS_getLastError());
                return 1;  /* oh well. */
            } /* if */

            printf(" ... test file written ...\n");
            f = PHYSFS_openRead("test.txt");
            if (f == NULL)
            {
                printf("Failed to reopen stress file for reading: %s.\n", PHYSFS_getLastError());
                return 1;
            } /* if */

            if (!PHYSFS_setBuffer(f, num))
            {
                printf("PHYSFS_setBuffer() failed: %s.\n", PHYSFS_getLastError());
                PHYSFS_close(f);
                return 1;
            } /* if */

            for (i = 0; i < 10; i++)
            {
                for (j = 0; j < 10000; j++)
                {
                    PHYSFS_uint32 right = 1 + (PHYSFS_uint32) (35.0 * rand() / (RAND_MAX + 1.0));
                    PHYSFS_uint32 left = 36 - right;
                    if (PHYSFS_readBytes(f, buf2, left) != left)
                    {
                        printf("PHYSFS_readBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */

                    if (PHYSFS_readBytes(f, buf2 + left, right) != right)
                    {
                        printf("PHYSFS_readBytes() failed: %s.\n", PHYSFS_getLastError());
                        PHYSFS_close(f);
                        return 1;
                    } /* if */

                    rndnum = 1 + (int) (1000.0 * rand() / (RAND_MAX + 1.0));
                    if (rndnum == 42)
                    {
                        if (!PHYSFS_flush(f))
                        {
                            printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                            PHYSFS_close(f);
                            return 1;
                        } /* if */
                    } /* if */

                    if (memcmp(buf, buf2, 36) != 0)
                    {
                        printf("readback is mismatched on iterations (%d, %d).\n", i, j);
                        printf("wanted: [");
                        for (i = 0; i < 36; i++)
                            printf("%c", buf[i]);
                        printf("]\n");

                        printf("   got: [");
                        for (i = 0; i < 36; i++)
                            printf("%c", buf2[i]);
                        printf("]\n");
                        PHYSFS_close(f);
                        return 1;
                    } /* if */
                } /* for */

                if (!PHYSFS_flush(f))
                {
                    printf("PHYSFS_flush() failed: %s.\n", PHYSFS_getLastError());
                    PHYSFS_close(f);
                    return 1;
                } /* if */

            } /* for */

            printf(" ... test file read ...\n");

            if (!PHYSFS_eof(f))
                printf("PHYSFS_eof() returned true! That's wrong.\n");

            if (!PHYSFS_close(f))
            {
                printf("PHYSFS_close() failed: %s.\n", PHYSFS_getLastError());
                return 1;  /* oh well. */
            } /* if */

            PHYSFS_delete("test.txt");
            printf("stress test completed successfully.\n");
        } /* else */
    } /* else */

    return 1;
}